

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

bool __thiscall cursespp::Window::FocusInParent(Window *this)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> a_Stack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  iVar2 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x25])();
  if ((CONCAT44(extraout_var,iVar2) != 0) &&
     (plVar3 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&IWindow::typeinfo,
                                      &ILayout::typeinfo,0xfffffffffffffffe), plVar3 != (long *)0x0)
     ) {
    std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cursespp::IWindow,void>
              (a_Stack_28,
               (__weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cursespp::IWindow>);
    uVar1 = (**(code **)(*plVar3 + 0x60))(plVar3,a_Stack_28);
    if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return (bool)uVar1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool Window::FocusInParent() {
    ASSERT_MAIN_THREAD();

    auto layout = dynamic_cast<ILayout*>(this->GetParent());
    if (layout) {
        return layout->SetFocus(shared_from_this());
    }
    return false;
}